

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileAnnonFunc(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken *pSVar1;
  sxu32 nKeyLen;
  sxi32 sVar2;
  jx9_value *pObj;
  SyHashEntry *pSVar3;
  jx9_vm_func **ppFunc;
  sxu32 nIdx;
  jx9_vm_func *pAnnonFunc;
  SyString sName;
  char zName [512];
  
  pSVar1 = pGen->pIn;
  pGen->pIn = pSVar1 + 1;
  if ((pSVar1[1].nType & 0xc) != 0) {
    pGen->pIn = pSVar1 + 2;
  }
  pObj = jx9VmReserveConstObj(pGen->pVm,&nIdx);
  if (pObj == (jx9_value *)0x0) {
    GenStateOutOfMem(pGen);
  }
  else {
    do {
      ppFunc = (jx9_vm_func **)(ulong)(uint)jx9CompileAnnonFunc::iCnt;
      jx9CompileAnnonFunc::iCnt = jx9CompileAnnonFunc::iCnt + 1;
      nKeyLen = SyBufferFormat(zName,0x200,"[lambda_%d]");
      pSVar3 = SyHashGet(&pGen->pVm->hFunction,zName,nKeyLen);
      if (0x1fd < nKeyLen) break;
    } while (pSVar3 != (SyHashEntry *)0x0);
    sName.zString = zName;
    sName.nByte = nKeyLen;
    jx9MemObjInitFromString(pGen->pVm,pObj,&sName);
    sVar2 = GenStateCompileFunc(pGen,&sName,(sxi32)&pAnnonFunc,ppFunc);
    if (sVar2 != -10) {
      jx9VmEmitInstr(pGen->pVm,4,0,nIdx,(void *)0x0,(sxu32 *)0x0);
      return 0;
    }
  }
  return -10;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileAnnonFunc(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	jx9_vm_func *pAnnonFunc; /* Annonymous function body */
	char zName[512];         /* Unique lambda name */
	static int iCnt = 1;     /* There is no worry about thread-safety here, because only
							  * one thread is allowed to compile the script.
						      */
	jx9_value *pObj;
	SyString sName;
	sxu32 nIdx;
	sxu32 nLen;
	sxi32 rc;

	pGen->pIn++; /* Jump the 'function' keyword */
	if( pGen->pIn->nType & (JX9_TK_ID|JX9_TK_KEYWORD) ){
		pGen->pIn++;
	}
	/* Reserve a constant for the lambda */
	pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pObj == 0 ){
		GenStateOutOfMem(pGen);
		SXUNUSED(iCompileFlag); /* cc warning */
		return SXERR_ABORT;
	}
	/* Generate a unique name */
	nLen = SyBufferFormat(zName, sizeof(zName), "[lambda_%d]", iCnt++);
	/* Make sure the generated name is unique */
	while( SyHashGet(&pGen->pVm->hFunction, zName, nLen) != 0 && nLen < sizeof(zName) - 2 ){
		nLen = SyBufferFormat(zName, sizeof(zName), "[lambda_%d]", iCnt++);
	}
	SyStringInitFromBuf(&sName, zName, nLen);
	jx9MemObjInitFromString(pGen->pVm, pObj, &sName);
	/* Compile the lambda body */
	rc = GenStateCompileFunc(&(*pGen),&sName,0,&pAnnonFunc);
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}